

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O2

int __thiscall MixerContext::auto_matrix(MixerContext *this)

{
  cubeb_sample_format cVar1;
  bool bVar2;
  uint32_t i_3;
  cubeb_channel_layout layout;
  cubeb_channel_layout layout_00;
  uint32_t i;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  double (*padVar7) [32];
  float (*pafVar8) [32];
  double (*padVar9) [32];
  char *pcVar10;
  undefined8 *puVar11;
  long lVar12;
  uint32_t out_i;
  uint32_t j;
  ulong uVar13;
  int iVar14;
  undefined8 *puVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined8 local_a48 [2];
  double local_a38;
  double local_a30;
  double local_a28;
  double local_a18;
  double local_a08;
  double local_a00;
  double local_9a8;
  double local_9a0;
  double local_990;
  double local_980;
  double local_978;
  double local_968;
  double local_928;
  double dStack_920;
  double local_918;
  double local_910;
  double local_908;
  double dStack_900;
  double local_8f8;
  double dStack_8f0;
  double local_8e8;
  double local_8e0;
  double dStack_8d8;
  double local_7c8;
  double local_7c0;
  double local_738;
  double local_728;
  double local_5a8;
  double dStack_5a0;
  double local_580;
  double dStack_578;
  double local_518;
  double local_4f8;
  double local_480;
  double local_468;
  
  puVar15 = local_a48;
  puVar11 = local_a48;
  memset(local_a48,0,0xa20);
  layout = clean_layout(this->_in_ch_layout);
  layout_00 = clean_layout(this->_out_ch_layout);
  bVar2 = sane_layout(layout);
  if (!bVar2) {
    if (g_cubeb_log_callback == (cubeb_log_callback)0x0) {
      return -1;
    }
    if ((int)g_cubeb_log_level < 1) {
      return -1;
    }
    uVar3 = this->_in_ch_layout;
    pcVar10 = "%s:%d: Input Layout %x is not supported\n";
    uVar6 = 0xc1;
LAB_0010eeb5:
    (*g_cubeb_log_callback)(pcVar10,"cubeb_mixer.cpp",uVar6,(ulong)uVar3);
    return -1;
  }
  bVar2 = sane_layout(layout_00);
  if (!bVar2) {
    if (g_cubeb_log_callback == (cubeb_log_callback)0x0) {
      return -1;
    }
    if ((int)g_cubeb_log_level < 1) {
      return -1;
    }
    uVar3 = this->_out_ch_layout;
    pcVar10 = "%s:%d: Output Layout %x is not supported\n";
    uVar6 = 0xc6;
    goto LAB_0010eeb5;
  }
  for (lVar4 = 0; lVar4 != 0x12; lVar4 = lVar4 + 1) {
    if ((1 << ((byte)lVar4 & 0x1f) & layout & layout_00) != 0) {
      *puVar15 = 0x3ff0000000000000;
    }
    puVar15 = puVar15 + 0x13;
  }
  uVar3 = layout & ~layout_00;
  if (((~layout_00 & 3) == 0) && ((uVar3 & 4) != 0)) {
    if ((layout & 3) == 0) {
      dVar18 = 0.7071067811865476;
    }
    else {
      dVar18 = (double)this->_center_mix_level;
    }
    local_a38 = local_a38 + dVar18;
    local_9a8 = dVar18 + local_9a8;
  }
  if (((layout_00 & 4) != 0) && ((uVar3 & 3) != 0)) {
    local_928 = local_928 + 0.7071067811865476;
    dStack_920 = dStack_920 + 0.7071067811865476;
    if ((layout & 4) != 0) {
      local_918 = (double)this->_center_mix_level * 1.4142135623730951;
    }
  }
  if ((uVar3 >> 8 & 1) != 0) {
    if ((layout_00 & 0x10) == 0) {
      if ((layout_00 >> 9 & 1) == 0) {
        if ((layout_00 & 1) == 0) {
          if ((layout_00 & 4) != 0) {
            local_8e8 = (double)this->_surround_mix_level * 0.7071067811865476 + local_8e8;
          }
        }
        else {
          dVar18 = (double)this->_surround_mix_level * 0.7071067811865476;
          local_a08 = local_a08 + dVar18;
          local_978 = dVar18 + local_978;
        }
      }
      else {
        local_4f8 = local_4f8 + 0.7071067811865476;
        local_468 = local_468 + 0.7071067811865476;
      }
    }
    else {
      local_7c8 = local_7c8 + 0.7071067811865476;
      local_738 = local_738 + 0.7071067811865476;
    }
  }
  if ((uVar3 & 0x10) != 0) {
    if ((layout_00 >> 8 & 1) == 0) {
      if ((layout_00 >> 9 & 1) == 0) {
        if ((layout_00 & 1) == 0) {
          if ((layout_00 & 4) != 0) {
            dVar18 = (double)this->_surround_mix_level * 0.7071067811865476;
            local_908 = dVar18 + local_908;
            dStack_900 = dVar18 + dStack_900;
          }
        }
        else {
          local_a28 = local_a28 + (double)this->_surround_mix_level;
          local_990 = (double)this->_surround_mix_level + local_990;
        }
      }
      else {
        if ((layout >> 9 & 1) == 0) {
          dVar18 = 1.0;
        }
        else {
          dVar18 = 0.7071067811865476;
        }
        local_518 = local_518 + dVar18;
        local_480 = dVar18 + local_480;
      }
    }
    else {
      local_5a8 = local_5a8 + 0.7071067811865476;
      dStack_5a0 = dStack_5a0 + 0.7071067811865476;
    }
  }
  if ((uVar3 >> 9 & 1) != 0) {
    if ((layout_00 & 0x10) == 0) {
      if ((layout_00 >> 8 & 1) == 0) {
        if ((layout_00 & 1) == 0) {
          if ((layout_00 & 4) != 0) {
            dVar18 = (double)this->_surround_mix_level * 0.7071067811865476;
            local_8e0 = dVar18 + local_8e0;
            dStack_8d8 = dVar18 + dStack_8d8;
          }
        }
        else {
          local_a00 = local_a00 + (double)this->_surround_mix_level;
          local_968 = (double)this->_surround_mix_level + local_968;
        }
      }
      else {
        local_580 = local_580 + 0.7071067811865476;
        dStack_578 = dStack_578 + 0.7071067811865476;
      }
    }
    else {
      if ((layout & 0x10) == 0) {
        dVar18 = 1.0;
      }
      else {
        dVar18 = 0.7071067811865476;
      }
      local_7c0 = local_7c0 + dVar18;
      local_728 = dVar18 + local_728;
    }
  }
  if ((uVar3 & 0x40) == 0) {
LAB_0010f217:
    if ((uVar3 & 8) == 0) goto LAB_0010f270;
    if ((layout_00 & 4) == 0) {
      if ((layout_00 & 1) != 0) {
        dVar18 = (double)this->_lfe_mix_level * 0.7071067811865476;
        local_a30 = local_a30 + dVar18;
        local_9a0 = dVar18 + local_9a0;
      }
      goto LAB_0010f270;
    }
  }
  else {
    if ((layout_00 & 1) != 0) {
      local_a18 = local_a18 + 1.0;
      local_980 = local_980 + 1.0;
      goto LAB_0010f217;
    }
    if ((layout_00 & 4) == 0) goto LAB_0010f270;
    local_8f8 = local_8f8 + 0.7071067811865476;
    dStack_8f0 = dStack_8f0 + 0.7071067811865476;
    if ((uVar3 & 8) == 0) goto LAB_0010f270;
  }
  local_910 = (double)this->_lfe_mix_level + local_910;
LAB_0010f270:
  padVar7 = this->_matrix;
  uVar16 = 0;
  uVar17 = 0;
  uVar3 = 0;
  for (uVar5 = 0; uVar5 != 0x20; uVar5 = uVar5 + 1) {
    if ((layout_00 >> ((uint)uVar5 & 0x1f) & 1) != 0) {
      dVar18 = 0.0;
      dVar19 = 1.0;
      if ((layout_00 & layout & 1 << ((byte)uVar5 & 0x1f)) == 0) {
        dVar19 = 0.0;
      }
      iVar14 = 0;
      for (uVar13 = 0; uVar13 != 0x20; uVar13 = uVar13 + 1) {
        if ((layout >> ((uint)uVar13 & 0x1f) & 1) != 0) {
          if (uVar13 < 0x12 && uVar5 < 0x12) {
            dVar20 = *(double *)((long)puVar11 + uVar13 * 8);
          }
          else {
            dVar20 = dVar19;
            if (uVar5 != uVar13) {
              dVar20 = 0.0;
            }
          }
          padVar7[uVar3][iVar14] = dVar20;
          dVar18 = dVar18 + ABS(dVar20);
          iVar14 = iVar14 + 1;
        }
      }
      if (dVar18 <= (double)CONCAT44(uVar17,uVar16)) {
        dVar18 = (double)CONCAT44(uVar17,uVar16);
      }
      uVar3 = uVar3 + 1;
      uVar16 = SUB84(dVar18,0);
      uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
    }
    puVar11 = (undefined8 *)((long)puVar11 + 0x90);
  }
  cVar1 = this->_format;
  dVar18 = *(double *)(&DAT_00124360 + (ulong)(cVar1 == CUBEB_SAMPLE_S16LE) * 8);
  if (dVar18 <= (double)CONCAT44(uVar17,uVar16) && (double)CONCAT44(uVar17,uVar16) != dVar18) {
    padVar9 = padVar7;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 1) {
        (*padVar9)[lVar12] = (*padVar9)[lVar12] / ((double)CONCAT44(uVar17,uVar16) / dVar18);
      }
      padVar9 = padVar9 + 1;
    }
  }
  if (cVar1 != CUBEB_SAMPLE_FLOAT32LE) {
    return 0;
  }
  pafVar8 = this->_matrix_flt;
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
    for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 1) {
      (*pafVar8)[lVar12] = (float)(*padVar7)[lVar12];
    }
    padVar7 = padVar7 + 1;
    pafVar8 = pafVar8 + 1;
  }
  return 0;
}

Assistant:

int
MixerContext::auto_matrix()
{
  double matrix[NUM_NAMED_CHANNELS][NUM_NAMED_CHANNELS] = {{0}};
  double maxcoef = 0;
  float maxval;

  cubeb_channel_layout in_ch_layout = clean_layout(_in_ch_layout);
  cubeb_channel_layout out_ch_layout = clean_layout(_out_ch_layout);

  if (!sane_layout(in_ch_layout)) {
    // Channel Not Supported
    LOG("Input Layout %x is not supported", _in_ch_layout);
    return -1;
  }

  if (!sane_layout(out_ch_layout)) {
    LOG("Output Layout %x is not supported", _out_ch_layout);
    return -1;
  }

  for (uint32_t i = 0; i < FF_ARRAY_ELEMS(matrix); i++) {
    if (in_ch_layout & out_ch_layout & (1U << i)) {
      matrix[i][i] = 1.0;
    }
  }

  cubeb_channel_layout unaccounted = in_ch_layout & ~out_ch_layout;

  // Rematrixing is done via a matrix of coefficient that should be applied to
  // all channels. Channels are treated as pair and must be symmetrical (if a
  // left channel exists, the corresponding right should exist too) unless the
  // output layout has similar layout. Channels are then mixed toward the front
  // center or back center if they exist with a slight bias toward the front.

  if (unaccounted & CHANNEL_FRONT_CENTER) {
    if ((out_ch_layout & CUBEB_LAYOUT_STEREO) == CUBEB_LAYOUT_STEREO) {
      if (in_ch_layout & CUBEB_LAYOUT_STEREO) {
        matrix[FRONT_LEFT][FRONT_CENTER] += _center_mix_level;
        matrix[FRONT_RIGHT][FRONT_CENTER] += _center_mix_level;
      } else {
        matrix[FRONT_LEFT][FRONT_CENTER] += M_SQRT1_2;
        matrix[FRONT_RIGHT][FRONT_CENTER] += M_SQRT1_2;
      }
    }
  }
  if (unaccounted & CUBEB_LAYOUT_STEREO) {
    if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][FRONT_LEFT] += M_SQRT1_2;
      matrix[FRONT_CENTER][FRONT_RIGHT] += M_SQRT1_2;
      if (in_ch_layout & CHANNEL_FRONT_CENTER)
        matrix[FRONT_CENTER][FRONT_CENTER] = _center_mix_level * M_SQRT2;
    }
  }

  if (unaccounted & CHANNEL_BACK_CENTER) {
    if (out_ch_layout & CHANNEL_BACK_LEFT) {
      matrix[BACK_LEFT][BACK_CENTER] += M_SQRT1_2;
      matrix[BACK_RIGHT][BACK_CENTER] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_SIDE_LEFT) {
      matrix[SIDE_LEFT][BACK_CENTER] += M_SQRT1_2;
      matrix[SIDE_RIGHT][BACK_CENTER] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_RIGHT][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
    }
  }
  if (unaccounted & CHANNEL_BACK_LEFT) {
    if (out_ch_layout & CHANNEL_BACK_CENTER) {
      matrix[BACK_CENTER][BACK_LEFT] += M_SQRT1_2;
      matrix[BACK_CENTER][BACK_RIGHT] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_SIDE_LEFT) {
      if (in_ch_layout & CHANNEL_SIDE_LEFT) {
        matrix[SIDE_LEFT][BACK_LEFT] += M_SQRT1_2;
        matrix[SIDE_RIGHT][BACK_RIGHT] += M_SQRT1_2;
      } else {
        matrix[SIDE_LEFT][BACK_LEFT] += 1.0;
        matrix[SIDE_RIGHT][BACK_RIGHT] += 1.0;
      }
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][BACK_LEFT] += _surround_mix_level;
      matrix[FRONT_RIGHT][BACK_RIGHT] += _surround_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][BACK_LEFT] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_CENTER][BACK_RIGHT] += _surround_mix_level * M_SQRT1_2;
    }
  }

  if (unaccounted & CHANNEL_SIDE_LEFT) {
    if (out_ch_layout & CHANNEL_BACK_LEFT) {
      /* if back channels do not exist in the input, just copy side
         channels to back channels, otherwise mix side into back */
      if (in_ch_layout & CHANNEL_BACK_LEFT) {
        matrix[BACK_LEFT][SIDE_LEFT] += M_SQRT1_2;
        matrix[BACK_RIGHT][SIDE_RIGHT] += M_SQRT1_2;
      } else {
        matrix[BACK_LEFT][SIDE_LEFT] += 1.0;
        matrix[BACK_RIGHT][SIDE_RIGHT] += 1.0;
      }
    } else if (out_ch_layout & CHANNEL_BACK_CENTER) {
      matrix[BACK_CENTER][SIDE_LEFT] += M_SQRT1_2;
      matrix[BACK_CENTER][SIDE_RIGHT] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][SIDE_LEFT] += _surround_mix_level;
      matrix[FRONT_RIGHT][SIDE_RIGHT] += _surround_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][SIDE_LEFT] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_CENTER][SIDE_RIGHT] += _surround_mix_level * M_SQRT1_2;
    }
  }

  if (unaccounted & CHANNEL_FRONT_LEFT_OF_CENTER) {
    if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][FRONT_LEFT_OF_CENTER] += 1.0;
      matrix[FRONT_RIGHT][FRONT_RIGHT_OF_CENTER] += 1.0;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][FRONT_LEFT_OF_CENTER] += M_SQRT1_2;
      matrix[FRONT_CENTER][FRONT_RIGHT_OF_CENTER] += M_SQRT1_2;
    }
  }
  /* mix LFE into front left/right or center */
  if (unaccounted & CHANNEL_LOW_FREQUENCY) {
    if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][LOW_FREQUENCY] += _lfe_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][LOW_FREQUENCY] += _lfe_mix_level * M_SQRT1_2;
      matrix[FRONT_RIGHT][LOW_FREQUENCY] += _lfe_mix_level * M_SQRT1_2;
    }
  }

  // Normalize the conversion matrix.
  for (uint32_t out_i = 0, i = 0; i < CHANNELS_MAX; i++) {
    double sum = 0;
    int in_i = 0;
    if ((out_ch_layout & (1U << i)) == 0) {
      continue;
    }
    for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
      if ((in_ch_layout & (1U << j)) == 0) {
        continue;
      }
      if (i < FF_ARRAY_ELEMS(matrix) && j < FF_ARRAY_ELEMS(matrix[0])) {
        _matrix[out_i][in_i] = matrix[i][j];
      } else {
        _matrix[out_i][in_i] =
            i == j && (in_ch_layout & out_ch_layout & (1U << i));
      }
      sum += fabs(_matrix[out_i][in_i]);
      in_i++;
    }
    maxcoef = std::max(maxcoef, sum);
    out_i++;
  }

  if (_format == CUBEB_SAMPLE_S16NE) {
    maxval = 1.0;
  } else {
    maxval = INT_MAX;
  }

  // Normalize matrix if needed.
  if (maxcoef > maxval) {
    maxcoef /= maxval;
    for (uint32_t i = 0; i < CHANNELS_MAX; i++)
      for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
        _matrix[i][j] /= maxcoef;
      }
  }

  if (_format == CUBEB_SAMPLE_FLOAT32NE) {
    for (uint32_t i = 0; i < FF_ARRAY_ELEMS(_matrix); i++) {
      for (uint32_t j = 0; j < FF_ARRAY_ELEMS(_matrix[0]); j++) {
        _matrix_flt[i][j] = _matrix[i][j];
      }
    }
  }

  return 0;
}